

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int Cudd_bddVarConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  DdHalfWord i_00;
  int iVar1;
  DdNode *pDVar2;
  DdNode **ppDVar3;
  DdNode *n;
  int local_6c;
  int est;
  int est0;
  int est1;
  int i;
  DdNode *hlocal;
  DdNode *glocal;
  DdNode *var;
  DdNode *scan;
  DdNode *support;
  int min;
  int best;
  DdNode ***conjuncts_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar2 = Cudd_Support(dd,f);
  if (pDVar2 == (DdNode *)0x0) {
    dd_local._4_4_ = 0;
  }
  else if (*(int *)((ulong)pDVar2 & 0xfffffffffffffffe) == 0x7fffffff) {
    ppDVar3 = (DdNode **)malloc(8);
    *conjuncts = ppDVar3;
    if (*conjuncts == (DdNode **)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      dd_local._4_4_ = 0;
    }
    else {
      **conjuncts = f;
      *(int *)(((ulong)**conjuncts & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)**conjuncts & 0xfffffffffffffffe) + 4) + 1;
      dd_local._4_4_ = 1;
    }
  }
  else {
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    support._0_4_ = 1000000000;
    support._4_4_ = 0xffffffff;
    for (var = pDVar2; *(int *)((ulong)var & 0xfffffffffffffffe) != 0x7fffffff;
        var = (var->type).kids.T) {
      i_00 = var->index;
      iVar1 = Cudd_EstimateCofactor(dd,f,i_00,1);
      local_6c = Cudd_EstimateCofactor(dd,f,i_00,0);
      if (local_6c < iVar1) {
        local_6c = iVar1;
      }
      if (local_6c < (int)support) {
        support._0_4_ = local_6c;
        support._4_4_ = i_00;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar2);
    pDVar2 = Cudd_bddIthVar(dd,support._4_4_);
    n = Cudd_bddOr(dd,f,pDVar2);
    if (n == (DdNode *)0x0) {
      dd_local._4_4_ = 0;
    }
    else {
      *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
      pDVar2 = Cudd_bddOr(dd,f,(DdNode *)((ulong)pDVar2 ^ 1));
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        dd_local._4_4_ = 0;
      }
      else {
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        if (n == dd->one) {
          Cudd_RecursiveDeref(dd,n);
          ppDVar3 = (DdNode **)malloc(8);
          *conjuncts = ppDVar3;
          if (*conjuncts == (DdNode **)0x0) {
            Cudd_RecursiveDeref(dd,pDVar2);
            dd->errorCode = CUDD_MEMORY_OUT;
            dd_local._4_4_ = 0;
          }
          else {
            **conjuncts = pDVar2;
            dd_local._4_4_ = 1;
          }
        }
        else if (pDVar2 == dd->one) {
          Cudd_RecursiveDeref(dd,pDVar2);
          ppDVar3 = (DdNode **)malloc(8);
          *conjuncts = ppDVar3;
          if (*conjuncts == (DdNode **)0x0) {
            Cudd_RecursiveDeref(dd,n);
            dd->errorCode = CUDD_MEMORY_OUT;
            dd_local._4_4_ = 0;
          }
          else {
            **conjuncts = n;
            dd_local._4_4_ = 1;
          }
        }
        else {
          ppDVar3 = (DdNode **)malloc(0x10);
          *conjuncts = ppDVar3;
          if (*conjuncts == (DdNode **)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,pDVar2);
            dd->errorCode = CUDD_MEMORY_OUT;
            dd_local._4_4_ = 0;
          }
          else {
            **conjuncts = n;
            (*conjuncts)[1] = pDVar2;
            dd_local._4_4_ = 2;
          }
        }
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_bddVarConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int best;
    int min;
    DdNode *support, *scan, *var, *glocal, *hlocal;

    /* Find best cofactoring variable. */
    support = Cudd_Support(dd,f);
    if (support == NULL) return(0);
    if (Cudd_IsConstant(support)) {
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = f;
        cuddRef((*conjuncts)[0]);
        return(1);
    }
    cuddRef(support);
    min = 1000000000;
    best = -1;
    scan = support;
    while (!Cudd_IsConstant(scan)) {
        int i = scan->index;
        int est1 = Cudd_EstimateCofactor(dd,f,i,1);
        int est0 = Cudd_EstimateCofactor(dd,f,i,0);
        /* Minimize the size of the larger of the two cofactors. */
        int est = (est1 > est0) ? est1 : est0;
        if (est < min) {
            min = est;
            best = i;
        }
        scan = cuddT(scan);
    }
#ifdef DD_DEBUG
    assert(best >= 0 && best < dd->size);
#endif
    Cudd_RecursiveDeref(dd,support);

    var = Cudd_bddIthVar(dd,best);
    glocal = Cudd_bddOr(dd,f,var);
    if (glocal == NULL) {
        return(0);
    }
    cuddRef(glocal);
    hlocal = Cudd_bddOr(dd,f,Cudd_Not(var));
    if (hlocal == NULL) {
        Cudd_RecursiveDeref(dd,glocal);
        return(0);
    }
    cuddRef(hlocal);

    if (glocal != DD_ONE(dd)) {
        if (hlocal != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}